

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::C_GenerateRandom
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pRandomData,CK_ULONG ulRandomLen)

{
  char cVar1;
  int iVar2;
  CK_VOID_PTR pvVar3;
  CryptoFactory *pCVar4;
  undefined4 extraout_var;
  uchar *__src;
  CK_RV CVar6;
  ByteString randomData;
  ByteString local_48;
  long *plVar5;
  
  CVar6 = 400;
  if (this->isInitialised == true) {
    if (pRandomData == (CK_BYTE_PTR)0x0) {
      CVar6 = 7;
    }
    else {
      pvVar3 = HandleManager::getSession(this->handleManager,hSession);
      if (pvVar3 == (CK_VOID_PTR)0x0) {
        CVar6 = 0xb3;
      }
      else {
        pCVar4 = CryptoFactory::i();
        iVar2 = (*pCVar4->_vptr_CryptoFactory[8])(pCVar4,1);
        plVar5 = (long *)CONCAT44(extraout_var,iVar2);
        if (plVar5 == (long *)0x0) {
          CVar6 = 5;
        }
        else {
          ByteString::ByteString(&local_48);
          cVar1 = (**(code **)(*plVar5 + 0x10))(plVar5,&local_48,ulRandomLen);
          CVar6 = 5;
          if (cVar1 != '\0') {
            if (ulRandomLen != 0) {
              __src = ByteString::byte_str(&local_48);
              memcpy(pRandomData,__src,ulRandomLen);
            }
            CVar6 = 0;
          }
          local_48._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
          std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                    (&local_48.byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        }
      }
    }
  }
  return CVar6;
}

Assistant:

CK_RV SoftHSM::C_GenerateRandom(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pRandomData, CK_ULONG ulRandomLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pRandomData == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the RNG
	RNG* rng = CryptoFactory::i()->getRNG();
	if (rng == NULL) return CKR_GENERAL_ERROR;

	// Generate random data
	ByteString randomData;
	if (!rng->generateRandom(randomData, ulRandomLen)) return CKR_GENERAL_ERROR;

	// Return random data
	if (ulRandomLen != 0)
	{
		memcpy(pRandomData, randomData.byte_str(), ulRandomLen);
	}

	return CKR_OK;
}